

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# root.c
# Opt level: O1

gf eval(gf *f,gf a)

{
  gf gVar1;
  long lVar2;
  bool bVar3;
  
  gVar1 = f[0x40];
  lVar2 = 0x3f;
  do {
    gVar1 = gf_mul(gVar1,a);
    gVar1 = gf_add(gVar1,f[lVar2]);
    bVar3 = lVar2 != 0;
    lVar2 = lVar2 + -1;
  } while (bVar3);
  return gVar1;
}

Assistant:

gf eval(gf *f, gf a)
{
	int i;
	gf r;
	
	r = f[ SYS_T ];

	for (i = SYS_T-1; i >= 0; i--)
	{
		r = gf_mul(r, a);
		r = gf_add(r, f[i]);
	}

	return r;
}